

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O1

int checkerBig2(void)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  char *__s;
  char *pcVar3;
  bool bVar4;
  int d;
  int d3;
  int d2;
  int local_3c;
  int local_38;
  int local_34;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar1 = 0xffffffff;
  }
  else {
    iVar2 = 1;
    do {
      __s = ScanInt((FILE *)__stream,&local_3c);
      bVar4 = true;
      if (__s == "PASSED") {
        if (((local_3c == 2) || (iVar2 - 1U < 2)) || (iVar2 == 0x7c1)) {
          if (((iVar2 != 1 || local_3c == 0) && (iVar2 != 2 || local_3c == 2)) &&
             (local_3c == 1 || iVar2 != 0x7c1)) {
            bVar4 = false;
            __s = "PASSED";
            goto LAB_00103ca5;
          }
        }
        printf("wrong output -- ");
        __s = "FAILED";
      }
LAB_00103ca5:
    } while ((!bVar4) && (bVar4 = iVar2 != 5000, iVar2 = iVar2 + 1, bVar4));
    if (__s == "PASSED") {
      pcVar3 = ScanIntInt((FILE *)__stream,&local_3c,&local_34);
      __s = "FAILED";
      if ((pcVar3 == "PASSED") && (pcVar3 = ScanInt((FILE *)__stream,&local_38), pcVar3 == "PASSED")
         ) {
        if ((local_3c == 2) && ((local_34 == 0x7c1 && (local_38 == 1)))) {
          __s = "PASSED";
        }
        else {
          printf("wrong output -- ");
        }
      }
    }
    if (__s == "PASSED") {
      iVar2 = HaveGarbageAtTheEnd((FILE *)__stream);
      if (iVar2 == 0) {
        __s = "PASSED";
      }
      else {
        __s = "FAILED";
      }
    }
    fclose(__stream);
    puts(__s);
    uVar1 = (uint)(__s == "FAILED");
  }
  testN = testN + 1;
  return uVar1;
}

Assistant:

static int checkerBig2(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i;
    const char* message = Pass;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 1; i <= 5000; i++) {
        int d;
        message = ScanInt(out, &d);
        if (message != Pass) {
            break;
        }
        if (i != 1 && i != 2 && i != 1985 && d != 2) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
        if (i == 1 && d != 0) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
        if (i == 2 && d != 2) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
        if (i == 1985 && d != 1) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
    }
    if (message == Pass) {
        int d1, d2, d3;
        if (ScanIntInt(out, &d1, &d2) != Pass || ScanInt(out, &d3) != Pass) {
            message = Fail;
        } else if (d1 != 2 || d2 != 1985 || d3 != 1) {
            printf("wrong output -- ");
            message = Fail;
        }
    }
    if (message == Pass && HaveGarbageAtTheEnd(out)) {
        message = Fail;
    }
    fclose(out);
    printf("%s\n", message);
    testN++;
    return message == Fail;
}